

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O2

void compile_backtrackingpath(compiler_common *common,backtrack_common *current)

{
  short sVar1;
  jump_list *pjVar2;
  compiler_common *common_00;
  then_trap_backtrack *ptVar3;
  sljit_label *psVar4;
  PCRE2_SPTR16 cc;
  backtrack_common *pbVar5;
  sljit_jump *psVar6;
  sljit_label *label;
  sljit_jump *psVar7;
  int iVar8;
  long srcw;
  jump_list **list;
  sljit_compiler *psVar9;
  sljit_s32 sVar10;
  sljit_sw sVar11;
  long lVar12;
  sljit_compiler *psVar13;
  int src;
  uint size;
  PCRE2_SPTR16 *in_stack_ffffffffffffff18;
  PCRE2_UCHAR16 type;
  compiler_common *local_d8;
  backtrack_common *local_d0;
  PCRE2_UCHAR16 opcode;
  backtrack_common *local_c0;
  sljit_u32 max;
  jump_list **local_b0;
  jump_list **local_a8;
  jump_list **local_a0;
  jump_list **local_98;
  then_trap_backtrack *local_90;
  sljit_compiler *local_88;
  sljit_u32 exact;
  jump_list *jumplist;
  jump_list *pjStack_70;
  backtrack_common *local_68;
  jump_list *pjStack_60;
  compiler_common *local_58;
  jump_list *pjStack_50;
  undefined8 local_48;
  backtrack_common *local_40;
  sljit_u32 local_38 [2];
  
  psVar13 = common->compiler;
  local_90 = common->then_trap;
  local_a0 = &common->revertframes;
  local_a8 = &common->quit;
  local_98 = &common->positive_assertion_quit;
  local_b0 = &common->reset_match;
  local_d8 = common;
  local_88 = psVar13;
LAB_00139ec0:
  if (current == (backtrack_common *)0x0) {
    common->then_trap = local_90;
    return;
  }
  pjVar2 = current->nextbacktracks;
  if (pjVar2 != (jump_list *)0x0) {
    psVar4 = sljit_emit_label(psVar13);
    set_jumps(pjVar2,psVar4);
  }
  common_00 = (compiler_common *)current->cc;
  sVar1 = *(short *)&common_00->compiler;
  psVar9 = psVar13;
  switch(sVar1) {
  case 3:
    sljit_emit_op1(psVar13,0x20,1,0,0x8c,0);
    free_stack(common,1);
    iVar8 = common->ovector_start;
LAB_0013ad86:
    sVar10 = 1;
LAB_0013ad91:
    sVar11 = 0;
    goto LAB_0013ad94;
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x6e:
  case 0x6f:
  case 0x70:
    psVar13 = common->compiler;
    max = 0;
    jumplist = (jump_list *)0x0;
    iVar8 = *(int *)((long)common->private_data_ptrs + ((long)common_00 - (long)common->start) * 2);
    lVar12 = (long)iVar8;
    local_d0 = current;
    cc = get_iterator_parameters
                   (common_00,&opcode,&type,(PCRE2_UCHAR16 *)&max,&exact,local_38,
                    in_stack_ffffffffffffff18);
    pbVar5 = local_d0;
    if (7 < opcode - 0x21) goto switchD_00139f95_caseD_23;
    src = (uint)(lVar12 != 0) * 2 + 0x8c;
    srcw = (long)(int)(lVar12 + 8);
    switch((uint)opcode) {
    default:
      if ((type != 0x16) && (type != 0x11)) {
        if (*(int *)&local_d0[1].top == 0) {
          sljit_emit_op1(psVar13,0x20,2,0,src,lVar12);
          psVar7 = sljit_emit_cmp(psVar13,5,2,0,src,srcw);
          skip_char_back(local_d8);
          sljit_emit_op1(psVar13,0x20,src,lVar12,2,0);
          psVar6 = sljit_emit_jump(psVar13,0x18);
          pbVar5 = local_d0[1].prev;
        }
        else {
          sljit_emit_op1(psVar13,0x20,2,0,src,lVar12);
          sljit_emit_op1(psVar13,0x20,4,0,src,lVar12 + 8);
          sljit_emit_op2(psVar13,0x62,2,0,2,0,0x40,2);
          psVar7 = sljit_emit_cmp(psVar13,5,2,0,4,0);
          local_c0 = (backtrack_common *)sljit_emit_label(psVar13);
          sljit_emit_op1(psVar13,0x23,1,0,0x82,-2);
          sljit_emit_op1(psVar13,0x20,src,lVar12,2,0);
          if ((ulong)*(uint *)&local_d0[1].nextbacktracks != 0) {
            sljit_emit_op2(psVar13,0x66,1,0,1,0,0x40,(ulong)*(uint *)&local_d0[1].nextbacktracks);
          }
          pbVar5 = local_d0;
          psVar6 = sljit_emit_cmp(psVar13,0,1,0,0x40,
                                  (ulong)*(ushort *)((long)&local_d0[1].nextbacktracks + 4));
          sljit_set_label(psVar6,(sljit_label *)pbVar5[1].prev);
          skip_char_back(local_d8);
          psVar6 = sljit_emit_cmp(psVar13,4,2,0,4,0);
          pbVar5 = local_c0;
        }
        sljit_set_label(psVar6,(sljit_label *)pbVar5);
        psVar4 = sljit_emit_label(psVar13);
        sljit_set_label(psVar7,psVar4);
        goto LAB_0013a812;
      }
      pjVar2 = local_d0[1].nextbacktracks;
      psVar4 = sljit_emit_label(psVar13);
      set_jumps(pjVar2,psVar4);
      sljit_emit_op1(psVar13,0x20,2,0,0x8c,0);
      free_stack(local_d8,1);
      psVar7 = sljit_emit_cmp(psVar13,1,2,0,0x40,0);
      sljit_set_label(psVar7,(sljit_label *)pbVar5[1].prev);
      break;
    case 0x22:
      sljit_emit_op1(psVar13,0x20,2,0,src,lVar12);
      compile_char1_matchingpath(local_d8,type,cc,&jumplist,1);
      sljit_emit_op1(psVar13,0x20,src,lVar12,2,0);
      psVar7 = sljit_emit_jump(psVar13,0x18);
      sljit_set_label(psVar7,(sljit_label *)local_d0[1].prev);
      pjVar2 = jumplist;
      psVar4 = sljit_emit_label(psVar13);
      set_jumps(pjVar2,psVar4);
      goto LAB_0013a30d;
    case 0x23:
    case 0x24:
      break;
    case 0x25:
      sljit_emit_op1(psVar13,0x20,2,0,src,lVar12);
      sljit_emit_op1(psVar13,0x20,src,lVar12,0x40,0);
      psVar7 = sljit_emit_cmp(psVar13,1,2,0,0x40,0);
      pbVar5 = local_d0;
      sljit_set_label(psVar7,(sljit_label *)local_d0[1].prev);
      local_c0 = (backtrack_common *)sljit_emit_jump(psVar13,0x18);
      pjVar2 = pbVar5[1].nextbacktracks;
      psVar4 = sljit_emit_label(psVar13);
      set_jumps(pjVar2,psVar4);
      sljit_emit_op1(psVar13,0x20,2,0,src,lVar12);
      sljit_emit_op1(psVar13,0x20,src,lVar12,0x40,0);
      psVar7 = sljit_emit_jump(psVar13,0x18);
      sljit_set_label(psVar7,(sljit_label *)pbVar5[1].prev);
      psVar4 = sljit_emit_label(psVar13);
      pbVar5 = local_c0;
      goto LAB_0013a305;
    case 0x26:
      sljit_emit_op1(psVar13,0x20,2,0,src,lVar12);
      sljit_emit_op1(psVar13,0x20,src,lVar12,0x40,0);
      pbVar5 = (backtrack_common *)sljit_emit_cmp(psVar13,0,2,0,0x40,0);
      compile_char1_matchingpath(local_d8,type,cc,&jumplist,1);
      psVar7 = sljit_emit_jump(psVar13,0x18);
      sljit_set_label(psVar7,(sljit_label *)local_d0[1].prev);
      pjVar2 = jumplist;
      psVar4 = sljit_emit_label(psVar13);
      set_jumps(pjVar2,psVar4);
      psVar4 = sljit_emit_label(psVar13);
LAB_0013a305:
      sljit_set_label((sljit_jump *)pbVar5,psVar4);
LAB_0013a30d:
      if (iVar8 == 0) {
        iVar8 = 1;
LAB_0013a81e:
        free_stack(local_d8,iVar8);
      }
      break;
    case 0x28:
      sljit_emit_op1(psVar13,0x20,1,0,src,srcw);
      sljit_emit_op1(psVar13,0x20,2,0,src,lVar12);
      sljit_emit_op2(psVar13,0x262,1,0,1,0,0x40,1);
      psVar7 = sljit_emit_jump(psVar13,0);
      add_jump(psVar13,&jumplist,psVar7);
      sljit_emit_op1(psVar13,0x20,src,srcw,1,0);
      compile_char1_matchingpath(local_d8,type,cc,&jumplist,1);
      sljit_emit_op1(psVar13,0x20,src,lVar12,2,0);
      psVar7 = sljit_emit_jump(psVar13,0x18);
      sljit_set_label(psVar7,(sljit_label *)local_d0[1].prev);
      pjVar2 = jumplist;
      psVar4 = sljit_emit_label(psVar13);
      set_jumps(pjVar2,psVar4);
LAB_0013a812:
      if (iVar8 != 0) break;
      iVar8 = 2;
      goto LAB_0013a81e;
    }
switchD_00139f95_caseD_23:
    current = local_d0;
    pjVar2 = local_d0->topbacktracks;
    psVar4 = sljit_emit_label(psVar13);
    set_jumps(pjVar2,psVar4);
    common = local_d8;
    psVar13 = local_88;
    break;
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
    psVar9 = common->compiler;
    size = 3 - ((ushort)(sVar1 - 0x71U) < 2);
    if ((*(byte *)((long)&common_00->compiler + (ulong)size * 2) & 1) == 0) {
      pjVar2 = current->topbacktracks;
      psVar4 = sljit_emit_label(psVar9);
      set_jumps(pjVar2,psVar4);
      sljit_emit_op1(psVar9,0x20,2,0,0x8c,0);
      free_stack(common,1);
      psVar7 = sljit_emit_cmp(psVar9,1,2,0,0x40,0);
      pbVar5 = current[1].prev;
LAB_0013aa34:
      sljit_set_label(psVar7,(sljit_label *)pbVar5);
    }
    else {
      sljit_emit_op1(psVar9,0x20,2,0,0x8c,0);
      psVar7 = sljit_emit_cmp(psVar9,1,2,0,0x40,0);
      sljit_set_label(psVar7,(sljit_label *)current[1].prev);
      pjVar2 = current->topbacktracks;
      psVar4 = sljit_emit_label(psVar9);
      set_jumps(pjVar2,psVar4);
LAB_0013a9f7:
      free_stack(common,size);
    }
    break;
  case 0x75:
    psVar9 = common->compiler;
    if (*(int *)&current[1].top == 0) {
      pjVar2 = current[1].nextbacktracks;
      if (pjVar2[1].jump == (sljit_jump *)0x0) {
        psVar7 = sljit_emit_jump(psVar9,0x19);
        add_jump(psVar9,(jump_list **)(pjVar2 + 2),psVar7);
      }
      else {
        psVar7 = sljit_emit_jump(psVar9,0x19);
        sljit_set_label(psVar7,(sljit_label *)pjVar2[1].jump);
      }
      psVar7 = sljit_emit_cmp(psVar9,1,1,0,0x40,0);
      sljit_set_label(psVar7,(sljit_label *)current[1].prev);
    }
    else {
      compile_backtrackingpath(common,current->top);
    }
    pjVar2 = current->topbacktracks;
    psVar4 = sljit_emit_label(psVar9);
    set_jumps(pjVar2,psVar4);
    break;
  case 0x76:
  case 0x77:
  case 0x9f:
  case 0xa0:
  case 0xa1:
    pjVar2 = current->topbacktracks;
    psVar4 = sljit_emit_label(psVar13);
    set_jumps(pjVar2,psVar4);
    break;
  case 0x7e:
  case 0x7f:
  case 0x80:
  case 0x81:
    goto switchD_00139f0c_caseD_7e;
  case 0x82:
  case 0x83:
  case 0x85:
  case 0x87:
  case 0x88:
  case 0x8a:
  case 0x8c:
switchD_00139f0c_caseD_82:
    pbVar5 = current;
LAB_0013ab9c:
    compile_bracket_backtrackingpath(common,pbVar5);
    break;
  case 0x84:
  case 0x86:
  case 0x89:
  case 0x8b:
  case 0x95:
    psVar9 = common->compiler;
    if (*(int *)((long)&current[1].prev + 4) < 0) {
      if ((sVar1 == 0x8b) || (sVar1 == 0x86)) {
        lVar12 = (ulong)*(ushort *)((long)&common_00->compiler + 4) * 0x10;
        sljit_emit_op1(psVar9,0x20,1,0,0x8c,0);
        sljit_emit_op1(psVar9,0x20,4,0,0x8c,8);
        sljit_emit_op1(psVar9,0x20,0x8e,common->ovector_start + lVar12,1,0);
        if (common->capture_last_ptr != 0) {
          sljit_emit_op1(psVar9,0x20,1,0,0x8c,0x10);
        }
        sljit_emit_op1(psVar9,0x20,0x8e,lVar12 + common->ovector_start + 8,4,0);
        if ((long)common->capture_last_ptr != 0) {
          sljit_emit_op1(psVar9,0x20,0x8e,(long)common->capture_last_ptr,1,0);
        }
      }
      pjVar2 = current->topbacktracks;
      psVar4 = sljit_emit_label(psVar9);
      set_jumps(pjVar2,psVar4);
      size = *(uint *)&current[1].nextbacktracks;
      goto LAB_0013a9f7;
    }
    sljit_emit_op1(psVar9,0x20,0xc,0,0x8e,(long)*(int *)&current[1].prev);
    psVar7 = sljit_emit_jump(psVar9,0x19);
    add_jump(psVar9,local_a0,psVar7);
    sljit_emit_op2(psVar9,0x60,0xc,0,0xc,0,0x40,(long)*(int *)((long)&current[1].prev + 4) * 8 + -8)
    ;
    if (current->topbacktracks != (jump_list *)0x0) {
      psVar7 = sljit_emit_jump(psVar9,0x18);
      pjVar2 = current->topbacktracks;
      psVar4 = sljit_emit_label(psVar9);
      set_jumps(pjVar2,psVar4);
      free_stack(common,*(int *)&current[1].nextbacktracks);
      psVar4 = sljit_emit_label(psVar9);
      sljit_set_label(psVar7,psVar4);
    }
    iVar8 = *(int *)&current[1].prev;
    sVar11 = (sljit_sw)(int)(~*(uint *)((long)&current[1].prev + 4) << 3);
    sVar10 = 0x8c;
LAB_0013ad94:
    sljit_emit_op1(psVar9,0x20,0x8e,(long)iVar8,sVar10,sVar11);
    break;
  case 0x93:
    if (0x81 < *(ushort *)((long)&common_00->compiler + 2)) goto switchD_00139f0c_caseD_82;
    goto switchD_00139f0c_caseD_7e;
  case 0x94:
    current->topbacktracks = (jump_list *)0x0;
    current->nextbacktracks = (jump_list *)0x0;
    current->top = (backtrack_common *)0x0;
    if (0x81 < *(ushort *)((long)&common_00->compiler + 2)) {
      compile_bracket_matchingpath(common,(PCRE2_SPTR16)common_00,current);
      pbVar5 = current->top;
      goto LAB_0013ab9c;
    }
    pjStack_50 = (jump_list *)0x0;
    local_68 = (backtrack_common *)0x0;
    pjStack_60 = (jump_list *)0x0;
    local_48._0_4_ = 0;
    local_48._4_4_ = 0;
    jumplist = (jump_list *)0x0;
    pjStack_70 = (jump_list *)0x0;
    local_40 = current[1].prev;
    local_58 = common_00;
    compile_assert_matchingpath(common,(PCRE2_SPTR16)common_00,(assert_backtrack *)&jumplist,0);
    break;
  case 0x96:
    iVar8 = 1;
    sljit_emit_op1(psVar13,0x20,1,0,0x8c,(ulong)(common->has_skip_arg != 0) << 5);
    if (common->has_skip_arg != 0) {
      sljit_emit_op1(psVar13,0x20,4,0,0x8c,0);
      iVar8 = (uint)(common->has_skip_arg != 0) * 4 + 1;
    }
    free_stack(common,iVar8);
    sljit_emit_op1(psVar13,0x20,0x8e,(long)common->mark_ptr,1,0);
    if (common->has_skip_arg != 0) {
      iVar8 = common->control_head_ptr;
      sVar10 = 4;
      goto LAB_0013ad91;
    }
    break;
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
    psVar9 = common->compiler;
    if ((ushort)(sVar1 - 0x9bU) < 2) {
      if (common->then_trap == (then_trap_backtrack *)0x0) {
        if (common->local_quit_available != 0) goto LAB_0013aa10;
        if (common->in_positive_assertion == 0) goto LAB_0013a6ff;
        psVar7 = sljit_emit_jump(psVar9,0x18);
        list = local_98;
      }
      else {
        sljit_emit_op1(psVar9,0x20,0xc,0,0x8e,(long)common->control_head_ptr);
        sljit_emit_op1(psVar9,0x20,1,0,0x40,1);
        sljit_emit_op1(psVar9,0x20,4,0,0x40,common->then_trap->start);
        psVar7 = sljit_emit_jump(psVar9,0x18);
        psVar4 = sljit_emit_label(psVar9);
        sljit_emit_op1(psVar9,0x20,0xc,0,0x8c,0);
        label = sljit_emit_label(psVar9);
        sljit_set_label(psVar7,label);
        psVar7 = sljit_emit_cmp(psVar9,1,0x8c,8,1,0);
        sljit_set_label(psVar7,psVar4);
        psVar7 = sljit_emit_cmp(psVar9,1,0x8c,0x10,4,0);
        sljit_set_label(psVar7,psVar4);
        ptVar3 = common->then_trap;
        psVar7 = sljit_emit_jump(psVar9,0x18);
        list = &ptVar3->quit;
      }
    }
    else {
      if (common->local_quit_available != 0) {
LAB_0013aa10:
        psVar4 = common->quit_label;
        psVar7 = sljit_emit_jump(psVar9,0x18);
        list = local_a8;
        goto joined_r0x0013a8f9;
      }
LAB_0013a6ff:
      if (sVar1 == 0x99) {
        sVar10 = 0x8c;
      }
      else {
        if (sVar1 == 0x9a) {
          sljit_emit_op1(psVar9,0x20,1,0,0x8e,(long)common->control_head_ptr);
          sVar10 = 0;
          sVar11 = 0x40;
          sljit_emit_op1(psVar9,0x20,2,0,0x40,(sljit_sw)(current->cc + 2));
          sljit_emit_icall(psVar9,0x111,0x146681,sVar10,sVar11);
          sljit_emit_op1(psVar9,0x20,2,0,1,0);
          psVar7 = sljit_emit_cmp(psVar9,1,1,0,0x40,0);
          list = local_b0;
          goto LAB_0013ac38;
        }
        sVar10 = 0x40;
      }
      sljit_emit_op1(psVar9,0x20,2,0,sVar10,0);
      psVar7 = sljit_emit_jump(psVar9,0x18);
      list = local_b0;
    }
    goto LAB_0013ac38;
  case 0x9d:
  case 0x9e:
    if (common->local_quit_available == 0) {
      sljit_emit_op1(psVar13,0x20,1,0,0x40,-1);
    }
    psVar4 = common->quit_label;
    psVar7 = sljit_emit_jump(psVar13,0x18);
    list = local_a8;
joined_r0x0013a8f9:
    local_a8 = list;
    if (psVar4 != (sljit_label *)0x0) {
      pbVar5 = (backtrack_common *)common->quit_label;
      goto LAB_0013aa34;
    }
LAB_0013ac38:
    add_jump(psVar9,list,psVar7);
    break;
  case 0xa5:
    if ((then_trap_backtrack *)current[1].prev == (then_trap_backtrack *)0x0) {
      psVar9 = common->compiler;
      iVar8 = *(int *)&current[1].topbacktracks;
      if (*(int *)&current[1].topbacktracks < 1) {
        iVar8 = 0;
      }
      sljit_emit_op1(psVar9,0x20,1,0,0x8c,(ulong)(uint)(iVar8 << 3));
      free_stack(common,iVar8 + 3);
      local_d0 = (backtrack_common *)sljit_emit_jump(psVar9,0x18);
      pbVar5 = current[1].top;
      psVar4 = sljit_emit_label(psVar9);
      set_jumps((jump_list *)pbVar5,psVar4);
      if (-1 < *(int *)&current[1].topbacktracks) {
        psVar7 = sljit_emit_jump(psVar9,0x19);
        add_jump(psVar9,local_a0,psVar7);
        sljit_emit_op2(psVar9,0x60,0xc,0,0xc,0,0x40,(long)*(int *)&current[1].topbacktracks * 8 + -8
                      );
      }
      sljit_emit_op1(psVar9,0x20,1,0,0x8c,0);
      free_stack(common,3);
      psVar4 = sljit_emit_label(psVar9);
      sljit_set_label((sljit_jump *)local_d0,psVar4);
      iVar8 = common->control_head_ptr;
      goto LAB_0013ad86;
    }
    common->then_trap = (then_trap_backtrack *)current[1].prev;
  }
switchD_00139f0c_caseD_4:
  current = current->prev;
  goto LAB_00139ec0;
switchD_00139f0c_caseD_7e:
  compile_assert_backtrackingpath(common,current);
  goto switchD_00139f0c_caseD_4;
}

Assistant:

static void compile_backtrackingpath(compiler_common *common, struct backtrack_common *current)
{
DEFINE_COMPILER;
then_trap_backtrack *save_then_trap = common->then_trap;

while (current)
  {
  if (current->nextbacktracks != NULL)
    set_jumps(current->nextbacktracks, LABEL());
  switch(*current->cc)
    {
    case OP_SET_SOM:
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(0));
    free_stack(common, 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), OVECTOR(0), TMP1, 0);
    break;

    case OP_STAR:
    case OP_MINSTAR:
    case OP_PLUS:
    case OP_MINPLUS:
    case OP_QUERY:
    case OP_MINQUERY:
    case OP_UPTO:
    case OP_MINUPTO:
    case OP_EXACT:
    case OP_POSSTAR:
    case OP_POSPLUS:
    case OP_POSQUERY:
    case OP_POSUPTO:
    case OP_STARI:
    case OP_MINSTARI:
    case OP_PLUSI:
    case OP_MINPLUSI:
    case OP_QUERYI:
    case OP_MINQUERYI:
    case OP_UPTOI:
    case OP_MINUPTOI:
    case OP_EXACTI:
    case OP_POSSTARI:
    case OP_POSPLUSI:
    case OP_POSQUERYI:
    case OP_POSUPTOI:
    case OP_NOTSTAR:
    case OP_NOTMINSTAR:
    case OP_NOTPLUS:
    case OP_NOTMINPLUS:
    case OP_NOTQUERY:
    case OP_NOTMINQUERY:
    case OP_NOTUPTO:
    case OP_NOTMINUPTO:
    case OP_NOTEXACT:
    case OP_NOTPOSSTAR:
    case OP_NOTPOSPLUS:
    case OP_NOTPOSQUERY:
    case OP_NOTPOSUPTO:
    case OP_NOTSTARI:
    case OP_NOTMINSTARI:
    case OP_NOTPLUSI:
    case OP_NOTMINPLUSI:
    case OP_NOTQUERYI:
    case OP_NOTMINQUERYI:
    case OP_NOTUPTOI:
    case OP_NOTMINUPTOI:
    case OP_NOTEXACTI:
    case OP_NOTPOSSTARI:
    case OP_NOTPOSPLUSI:
    case OP_NOTPOSQUERYI:
    case OP_NOTPOSUPTOI:
    case OP_TYPESTAR:
    case OP_TYPEMINSTAR:
    case OP_TYPEPLUS:
    case OP_TYPEMINPLUS:
    case OP_TYPEQUERY:
    case OP_TYPEMINQUERY:
    case OP_TYPEUPTO:
    case OP_TYPEMINUPTO:
    case OP_TYPEEXACT:
    case OP_TYPEPOSSTAR:
    case OP_TYPEPOSPLUS:
    case OP_TYPEPOSQUERY:
    case OP_TYPEPOSUPTO:
    case OP_CLASS:
    case OP_NCLASS:
#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH != 8
    case OP_XCLASS:
#endif
    compile_iterator_backtrackingpath(common, current);
    break;

    case OP_REF:
    case OP_REFI:
    case OP_DNREF:
    case OP_DNREFI:
    compile_ref_iterator_backtrackingpath(common, current);
    break;

    case OP_RECURSE:
    compile_recurse_backtrackingpath(common, current);
    break;

    case OP_ASSERT:
    case OP_ASSERT_NOT:
    case OP_ASSERTBACK:
    case OP_ASSERTBACK_NOT:
    compile_assert_backtrackingpath(common, current);
    break;

    case OP_ONCE:
    case OP_BRA:
    case OP_CBRA:
    case OP_COND:
    case OP_SBRA:
    case OP_SCBRA:
    case OP_SCOND:
    compile_bracket_backtrackingpath(common, current);
    break;

    case OP_BRAZERO:
    if (current->cc[1] > OP_ASSERTBACK_NOT)
      compile_bracket_backtrackingpath(common, current);
    else
      compile_assert_backtrackingpath(common, current);
    break;

    case OP_BRAPOS:
    case OP_CBRAPOS:
    case OP_SBRAPOS:
    case OP_SCBRAPOS:
    case OP_BRAPOSZERO:
    compile_bracketpos_backtrackingpath(common, current);
    break;

    case OP_BRAMINZERO:
    compile_braminzero_backtrackingpath(common, current);
    break;

    case OP_MARK:
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(common->has_skip_arg ? 4 : 0));
    if (common->has_skip_arg)
      OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(STACK_TOP), STACK(0));
    free_stack(common, common->has_skip_arg ? 5 : 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->mark_ptr, TMP1, 0);
    if (common->has_skip_arg)
      OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->control_head_ptr, TMP2, 0);
    break;

    case OP_THEN:
    case OP_THEN_ARG:
    case OP_PRUNE:
    case OP_PRUNE_ARG:
    case OP_SKIP:
    case OP_SKIP_ARG:
    compile_control_verb_backtrackingpath(common, current);
    break;

    case OP_COMMIT:
    case OP_COMMIT_ARG:
    if (!common->local_quit_available)
      OP1(SLJIT_MOV, SLJIT_RETURN_REG, 0, SLJIT_IMM, PCRE2_ERROR_NOMATCH);
    if (common->quit_label == NULL)
      add_jump(compiler, &common->quit, JUMP(SLJIT_JUMP));
    else
      JUMPTO(SLJIT_JUMP, common->quit_label);
    break;

    case OP_CALLOUT:
    case OP_CALLOUT_STR:
    case OP_FAIL:
    case OP_ACCEPT:
    case OP_ASSERT_ACCEPT:
    set_jumps(current->topbacktracks, LABEL());
    break;

    case OP_THEN_TRAP:
    /* A virtual opcode for then traps. */
    compile_then_trap_backtrackingpath(common, current);
    break;

    default:
    SLJIT_UNREACHABLE();
    break;
    }
  current = current->prev;
  }
common->then_trap = save_then_trap;
}